

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O1

void __thiscall
asio::detail::posix_event::
unlock_and_signal_one<asio::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  ulong uVar1;
  
  uVar1 = this->state_;
  this->state_ = uVar1 | 1;
  if (lock->locked_ == true) {
    if (lock->mutex_->enabled_ == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&lock->mutex_->mutex_);
    }
    lock->locked_ = false;
  }
  if (1 < uVar1) {
    pthread_cond_signal((pthread_cond_t *)this);
    return;
  }
  return;
}

Assistant:

void unlock_and_signal_one(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    state_ |= 1;
    bool have_waiters = (state_ > 1);
    lock.unlock();
    if (have_waiters)
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
  }